

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O0

CURLcode curlx_dyn_vaddf(dynbuf *s,char *fmt,__va_list_tag *ap)

{
  uchar *mem;
  size_t len;
  CURLcode result;
  char *str;
  __va_list_tag *ap_local;
  char *fmt_local;
  dynbuf *s_local;
  
  mem = (uchar *)curl_mvaprintf(fmt,ap);
  if (mem == (uchar *)0x0) {
    curlx_dyn_free(s);
    s_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    len = strlen((char *)mem);
    s_local._4_4_ = dyn_nappend(s,mem,len);
    free(mem);
  }
  return s_local._4_4_;
}

Assistant:

CURLcode Curl_dyn_vaddf(struct dynbuf *s, const char *fmt, va_list ap)
{
#ifdef BUILDING_LIBCURL
  int rc;
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  DEBUGASSERT(fmt);
  rc = Curl_dyn_vprintf(s, fmt, ap);

  if(!rc)
    return CURLE_OK;
  else if(rc == MERR_TOO_LARGE)
    return CURLE_TOO_LARGE;
  return CURLE_OUT_OF_MEMORY;
#else
  char *str;
  str = vaprintf(fmt, ap); /* this allocs a new string to append */

  if(str) {
    CURLcode result = dyn_nappend(s, (const unsigned char *)str, strlen(str));
    free(str);
    return result;
  }
  /* If we failed, we cleanup the whole buffer and return error */
  Curl_dyn_free(s);
  return CURLE_OUT_OF_MEMORY;
#endif
}